

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  type_info *ptVar1;
  bool bVar2;
  int iVar3;
  type_info *ptVar4;
  PyObject *pPVar5;
  PyObject **ppPVar6;
  undefined8 uVar7;
  char *pcVar8;
  PyTypeObject *pPVar9;
  size_t sVar10;
  mapped_type *pmVar11;
  mapped_type *ppvVar12;
  mapped_type *ppvVar13;
  handle *this_00;
  _typeobject *p_Var14;
  handle local_488;
  obj_attr_accessor local_480;
  str_attr_accessor local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator<char> local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  handle local_398;
  handle local_390;
  handle local_388;
  handle local_380;
  tuple_accessor local_378;
  handle local_358;
  PyTypeObject *local_350;
  type_info *local_348;
  type_info *tinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  PyTypeObject *local_2f8;
  PyHeapTypeObject *type;
  handle local_2e8;
  object type_holder;
  size_t size;
  char *tp_doc;
  tuple bases;
  size_t num_bases;
  handle local_2b8;
  PyObject *local_2b0;
  PyHeapTypeObject *type_1;
  object local_2a0;
  handle local_298;
  object local_290;
  object meta_name;
  string meta_name_;
  object metaclass;
  str local_258;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  string full_name;
  object local_1e8;
  handle local_1e0;
  object local_1d8;
  object local_1d0;
  object ht_qualname_meta;
  object ht_qualname;
  object local_1a0;
  PyObject *local_198;
  handle local_190;
  object scope_qualname;
  object local_168;
  PyObject *local_160;
  str_attr_accessor local_158;
  object local_138;
  PyObject *local_130;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  PyObject *local_c0;
  handle local_b8;
  object scope_module;
  handle local_a8;
  object name;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  type_index local_28;
  type_index tindex;
  internals *internals;
  type_record *rec_local;
  generic_type *this_local;
  
  tindex._M_target = (type_info *)get_internals();
  std::type_index::type_index(&local_28,rec->type);
  ptVar4 = get_type_info(rec->type,false);
  if (ptVar4 != (type_info *)0x0) {
    pcVar8 = rec->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar8,&local_89);
    std::operator+(&local_68,"generic_type: type \"",&local_88);
    std::operator+(&local_48,&local_68,"\" is already registered!");
    pybind11_fail(&local_48);
  }
  pPVar5 = (PyObject *)PyUnicode_FromString(rec->name);
  handle::handle(&scope_module.super_handle,pPVar5);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_a8,scope_module.super_handle.m_ptr);
  object::object((object *)&local_b8);
  bVar2 = handle::operator_cast_to_bool(&rec->scope);
  if (bVar2) {
    local_c0 = (rec->scope).m_ptr;
    bVar2 = hasattr((handle)local_c0,rec->name);
    if (bVar2) {
      pcVar8 = rec->name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar8,&local_121);
      std::operator+(&local_100,"generic_type: cannot initialize type \"",&local_120);
      std::operator+(&local_e0,&local_100,"\": an object with that name is already defined");
      pybind11_fail(&local_e0);
    }
    local_130 = (rec->scope).m_ptr;
    bVar2 = hasattr((handle)local_130,"__module__");
    if (bVar2) {
      object_api<pybind11::handle>::attr
                (&local_158,(object_api<pybind11::handle> *)rec,"__module__");
      accessor::operator_cast_to_object((accessor *)&local_138);
      object::operator=((object *)&local_b8,&local_138);
      object::~object(&local_138);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_158);
    }
    else {
      local_160 = (rec->scope).m_ptr;
      bVar2 = hasattr((handle)local_160,"__name__");
      if (bVar2) {
        object_api<pybind11::handle>::attr
                  ((str_attr_accessor *)&scope_qualname,(object_api<pybind11::handle> *)rec,
                   "__name__");
        accessor::operator_cast_to_object((accessor *)&local_168);
        object::operator=((object *)&local_b8,&local_168);
        object::~object(&local_168);
        accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::str_attr> *)&scope_qualname);
      }
    }
  }
  object::object((object *)&local_190);
  bVar2 = handle::operator_cast_to_bool(&rec->scope);
  if (bVar2) {
    local_198 = (rec->scope).m_ptr;
    bVar2 = hasattr((handle)local_198,"__qualname__");
    if (bVar2) {
      object_api<pybind11::handle>::attr
                ((str_attr_accessor *)&ht_qualname,(object_api<pybind11::handle> *)rec,
                 "__qualname__");
      accessor::operator_cast_to_object((accessor *)&local_1a0);
      object::operator=((object *)&local_190,&local_1a0);
      object::~object(&local_1a0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)&ht_qualname);
    }
  }
  object::object(&ht_qualname_meta);
  object::object(&local_1d0);
  bVar2 = handle::operator_cast_to_bool(&local_190);
  if (bVar2) {
    ppPVar6 = handle::ptr(&local_190);
    pPVar5 = *ppPVar6;
    ppPVar6 = handle::ptr(&local_a8);
    pPVar5 = (PyObject *)PyUnicode_FromFormat("%U.%U",pPVar5,*ppPVar6);
    handle::handle(&local_1e0,pPVar5);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_1d8,local_1e0);
    object::operator=(&ht_qualname_meta,&local_1d8);
    object::~object(&local_1d8);
  }
  else {
    object::operator=(&ht_qualname_meta,(object *)&local_a8);
  }
  if (((byte)rec->field_0x48 >> 3 & 1) != 0) {
    ppPVar6 = handle::ptr(&ht_qualname_meta.super_handle);
    pPVar5 = (PyObject *)PyUnicode_FromFormat("%U__Meta",*ppPVar6);
    handle::handle((handle *)((long)&full_name.field_2 + 8),pPVar5);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_1e8,(handle)full_name.field_2._8_8_);
    object::operator=(&local_1d0,&local_1e8);
    object::~object(&local_1e8);
  }
  bVar2 = handle::operator_cast_to_bool(&local_b8);
  metaclass.super_handle.m_ptr._7_1_ = 0;
  metaclass.super_handle.m_ptr._6_1_ = 0;
  metaclass.super_handle.m_ptr._5_1_ = 0;
  metaclass.super_handle.m_ptr._3_1_ = 0;
  if (bVar2) {
    str::str(&local_258,(object *)&local_b8);
    metaclass.super_handle.m_ptr._7_1_ = 1;
    str::operator_cast_to_string(&local_250,&local_258);
    metaclass.super_handle.m_ptr._6_1_ = 1;
    std::operator+(&local_230,&local_250,".");
    metaclass.super_handle.m_ptr._5_1_ = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   &local_230,rec->name);
  }
  else {
    pcVar8 = rec->name;
    std::allocator<char>::allocator();
    metaclass.super_handle.m_ptr._3_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,pcVar8,
               (allocator<char> *)((long)&metaclass.super_handle.m_ptr + 4));
  }
  if ((metaclass.super_handle.m_ptr._3_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&metaclass.super_handle.m_ptr + 4));
  }
  if ((metaclass.super_handle.m_ptr._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_230);
  }
  if ((metaclass.super_handle.m_ptr._6_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_250);
  }
  if ((metaclass.super_handle.m_ptr._7_1_ & 1) != 0) {
    str::~str(&local_258);
  }
  object::object((object *)((long)&meta_name_.field_2 + 8));
  if (((byte)rec->field_0x48 >> 3 & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   "__Meta");
    uVar7 = std::__cxx11::string::c_str();
    pPVar5 = (PyObject *)PyUnicode_FromString(uVar7);
    handle::handle(&local_298,pPVar5);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_290,local_298);
    pPVar5 = (PyObject *)(*_PyList_New)(&PyType_Type,0);
    handle::handle((handle *)&type_1,pPVar5);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_2a0,(handle)type_1);
    object::operator=((object *)((long)&meta_name_.field_2 + 8),&local_2a0);
    object::~object(&local_2a0);
    bVar2 = handle::operator_cast_to_bool((handle *)((long)&meta_name_.field_2 + 8));
    if ((!bVar2) || (bVar2 = handle::operator_cast_to_bool(&local_a8), !bVar2)) {
      pybind11_fail("generic_type::generic_type(): unable to create metaclass!");
    }
    ppPVar6 = handle::ptr((handle *)((long)&meta_name_.field_2 + 8));
    local_2b0 = *ppPVar6;
    local_2b8 = object::release(&local_290);
    ppPVar6 = handle::ptr(&local_2b8);
    local_2b0[0x35].ob_refcnt = (Py_ssize_t)*ppPVar6;
    num_bases = (size_t)object::release(&local_1d0);
    ppPVar6 = handle::ptr((handle *)&num_bases);
    local_2b0[0x36].ob_refcnt = (Py_ssize_t)*ppPVar6;
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pPVar9 = (PyTypeObject *)strdup(pcVar8);
    local_2b0[1].ob_type = pPVar9;
    local_2b0[0x10].ob_refcnt = (Py_ssize_t)&PyType_Type;
    local_2b0[10].ob_type = (PyTypeObject *)((ulong)local_2b0[10].ob_type | 0x200);
    iVar3 = PyType_Ready(local_2b0);
    if (iVar3 < 0) {
      pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
    }
    object::~object(&local_290);
    std::__cxx11::string::~string((string *)&meta_name);
  }
  bases.super_object.super_handle.m_ptr = (object)list::size(&rec->bases);
  tuple::tuple((tuple *)&tp_doc,&(rec->bases).super_object);
  size = 0;
  if ((rec->doc != (char *)0x0) && (bVar2 = options::show_user_defined_docstrings(), bVar2)) {
    sVar10 = strlen(rec->doc);
    type_holder.super_handle.m_ptr = (handle)(sVar10 + 1);
    size = PyObject_Malloc(type_holder.super_handle.m_ptr);
    memcpy((void *)size,rec->doc,(size_t)type_holder.super_handle.m_ptr);
  }
  pPVar5 = (PyObject *)(*_PyList_New)(&PyType_Type,0);
  handle::handle((handle *)&type,pPVar5);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_2e8,(handle)type);
  ppPVar6 = handle::ptr(&local_2e8);
  local_2f8 = (PyTypeObject *)*ppPVar6;
  bVar2 = handle::operator_cast_to_bool(&local_2e8);
  if ((bVar2) && (bVar2 = handle::operator_cast_to_bool(&local_a8), bVar2)) {
    ptVar4 = (type_info *)operator_new(0x68);
    ptVar4->get_buffer = (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0;
    ptVar4->get_buffer_data = (void *)0x0;
    (ptVar4->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar4->direct_conversions =
         (vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *)0x0;
    (ptVar4->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptVar4->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptVar4->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptVar4->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar4->init_holder = (_func_void_PyObject_ptr_void_ptr *)0x0;
    (ptVar4->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ptVar4->type = (PyTypeObject *)0x0;
    ptVar4->type_size = 0;
    ptVar4->simple_type = false;
    ptVar4->default_holder = false;
    *(undefined6 *)&ptVar4->field_0x62 = 0;
    type_info::type_info(ptVar4);
    ptVar4->type = local_2f8;
    ptVar4->type_size = rec->type_size;
    ptVar4->init_holder = rec->init_holder;
    local_348 = ptVar4;
    pmVar11 = std::
              unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
              ::operator[]((unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
                            *)(tindex._M_target + 0xe0),&local_28);
    ptVar4 = local_348;
    local_348->direct_conversions = pmVar11;
    local_348->default_holder = (bool)((byte)rec->field_0x48 >> 4 & 1);
    ppvVar12 = std::
               unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
               ::operator[]((unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
                             *)tindex._M_target,&local_28);
    ptVar1 = local_348;
    *ppvVar12 = ptVar4;
    local_350 = local_2f8;
    ppvVar13 = std::
               unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
               ::operator[]((unordered_map<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                             *)(tindex._M_target + 0x38),&local_350);
    *ppvVar13 = ptVar1;
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar8 = strdup(pcVar8);
    local_2f8->tp_name = pcVar8;
    local_2f8->tp_basicsize = rec->instance_size;
    if ((handle)bases.super_object.super_handle.m_ptr != (handle)0x0) {
      tuple::operator[](&local_378,(tuple *)&tp_doc,0);
      accessor::operator_cast_to_object((accessor *)&local_358);
      this_00 = handle::inc_ref(&local_358);
      p_Var14 = (_typeobject *)handle::ptr(this_00);
      local_2f8->tp_base = p_Var14;
      object::~object((object *)&local_358);
      accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor(&local_378);
      local_380 = object::release((object *)&tp_doc);
      ppPVar6 = handle::ptr(&local_380);
      local_2f8->tp_bases = *ppPVar6;
      rec->field_0x48 =
           rec->field_0x48 & 0xfe |
           ((rec->field_0x48 & 1) != 0 || 1 < (ulong)bases.super_object.super_handle.m_ptr);
    }
    local_388 = object::release((object *)&local_a8);
    ppPVar6 = handle::ptr(&local_388);
    local_2f8[2].tp_basicsize = (Py_ssize_t)*ppPVar6;
    local_390 = object::release(&ht_qualname_meta);
    ppPVar6 = handle::ptr(&local_390);
    local_2f8[2].tp_dealloc = (destructor)*ppPVar6;
    local_398 = object::release((object *)((long)&meta_name_.field_2 + 8));
    ppPVar6 = handle::ptr(&local_398);
    (local_2f8->ob_base).ob_base.ob_type = (PyTypeObject *)*ppPVar6;
    local_2f8->tp_as_number = (PyNumberMethods *)&local_2f8[1].tp_basicsize;
    local_2f8->tp_as_sequence = (PySequenceMethods *)&local_2f8[1].tp_mro;
    local_2f8->tp_as_mapping = (PyMappingMethods *)&local_2f8[1].tp_free;
    local_2f8->tp_init = init;
    local_2f8->tp_new = new_instance;
    local_2f8->tp_dealloc = rec->dealloc;
    local_2f8->tp_weaklistoffset = 0x18;
    local_2f8->tp_flags = local_2f8->tp_flags | 0x600;
    local_2f8->tp_flags = local_2f8->tp_flags & 0xffffffffffffbfff;
    if (((byte)rec->field_0x48 >> 1 & 1) != 0) {
      local_2f8->tp_flags = local_2f8->tp_flags | 0x4000;
      local_2f8->tp_dictoffset = local_2f8->tp_basicsize;
      local_2f8->tp_basicsize = local_2f8->tp_basicsize + 8;
      local_2f8->tp_getset = (PyGetSetDef *)generic_getset;
      local_2f8->tp_traverse = traverse;
      local_2f8->tp_clear = clear;
    }
    if (((byte)rec->field_0x48 >> 2 & 1) != 0) {
      local_2f8->tp_as_buffer = (PyBufferProcs *)&local_2f8[2].ob_base.ob_size;
      local_2f8[2].ob_base.ob_size = (Py_ssize_t)getbuffer;
      local_2f8[2].tp_name = (char *)releasebuffer;
    }
    local_2f8->tp_doc = (char *)size;
    ppPVar6 = handle::ptr(&local_2e8);
    (this->super_object).super_handle.m_ptr = *ppPVar6;
    iVar3 = PyType_Ready(local_2f8);
    if (-1 < iVar3) {
      bVar2 = handle::operator_cast_to_bool(&local_b8);
      if (bVar2) {
        object_api<pybind11::handle>::attr
                  (&local_460,(object_api<pybind11::handle> *)this,"__module__");
        accessor<pybind11::detail::accessor_policies::str_attr>::operator=
                  (&local_460,(object *)&local_b8);
        accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_460);
      }
      bVar2 = handle::operator_cast_to_bool(&rec->scope);
      if (bVar2) {
        handle::handle(&local_488,(PyObject *)local_2f8[2].tp_basicsize);
        object_api<pybind11::handle>::attr(&local_480,(object_api<pybind11::handle> *)rec,local_488)
        ;
        accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_480,this);
        accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_480);
      }
      if ((rec->field_0x48 & 1) != 0) {
        mark_parents_nonsimple(this,local_2f8);
      }
      object::release((object *)&local_2e8);
      object::~object((object *)&local_2e8);
      tuple::~tuple((tuple *)&tp_doc);
      object::~object((object *)((long)&meta_name_.field_2 + 8));
      std::__cxx11::string::~string((string *)local_210);
      object::~object(&local_1d0);
      object::~object(&ht_qualname_meta);
      object::~object((object *)&local_190);
      object::~object((object *)&local_b8);
      object::~object((object *)&local_a8);
      return;
    }
    pcVar8 = rec->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,pcVar8,&local_419);
    std::operator+(&local_3f8,&local_418,": PyType_Ready failed (");
    error_string_abi_cxx11_();
    std::operator+(&local_3d8,&local_3f8,&local_440);
    std::operator+(&local_3b8,&local_3d8,")!");
    pybind11_fail(&local_3b8);
  }
  pcVar8 = rec->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,pcVar8,(allocator<char> *)((long)&tinfo + 7));
  std::operator+(&local_318,&local_338,": Unable to create type object!");
  pybind11_fail(&local_318);
}

Assistant:

void initialize(type_record *rec) {
        auto &internals = get_internals();
        auto tindex = std::type_index(*(rec->type));

        if (get_type_info(*(rec->type)))
            pybind11_fail("generic_type: type \"" + std::string(rec->name) +
                          "\" is already registered!");

        auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec->name));
        object scope_module;
        if (rec->scope) {
            if (hasattr(rec->scope, rec->name))
                pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec->name) +
                        "\": an object with that name is already defined");

            if (hasattr(rec->scope, "__module__")) {
                scope_module = rec->scope.attr("__module__");
            } else if (hasattr(rec->scope, "__name__")) {
                scope_module = rec->scope.attr("__name__");
            }
        }

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        /* Qualified names for Python >= 3.3 */
        object scope_qualname;
        if (rec->scope && hasattr(rec->scope, "__qualname__"))
            scope_qualname = rec->scope.attr("__qualname__");
        object ht_qualname, ht_qualname_meta;
        if (scope_qualname)
            ht_qualname = reinterpret_steal<object>(PyUnicode_FromFormat(
                "%U.%U", scope_qualname.ptr(), name.ptr()));
        else
            ht_qualname = name;
        if (rec->metaclass)
            ht_qualname_meta = reinterpret_steal<object>(
                PyUnicode_FromFormat("%U__Meta", ht_qualname.ptr()));
#endif

#if !defined(PYPY_VERSION)
        std::string full_name = (scope_module ? ((std::string) pybind11::str(scope_module) + "." + rec->name)
                                              : std::string(rec->name));
#else
        std::string full_name = std::string(rec->name);
#endif

        /* Create a custom metaclass if requested (used for static properties) */
        object metaclass;
        if (rec->metaclass) {
            std::string meta_name_ = full_name + "__Meta";
            object meta_name = reinterpret_steal<object>(PYBIND11_FROM_STRING(meta_name_.c_str()));
            metaclass = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
            if (!metaclass || !name)
                pybind11_fail("generic_type::generic_type(): unable to create metaclass!");

            /* Danger zone: from now (and until PyType_Ready), make sure to
               issue no Python C API calls which could potentially invoke the
               garbage collector (the GC will call type_traverse(), which will in
               turn find the newly constructed type in an invalid state) */

            auto type = (PyHeapTypeObject*) metaclass.ptr();
            type->ht_name = meta_name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
            /* Qualified names for Python >= 3.3 */
            type->ht_qualname = ht_qualname_meta.release().ptr();
#endif
            type->ht_type.tp_name = strdup(meta_name_.c_str());
            type->ht_type.tp_base = &PyType_Type;
            type->ht_type.tp_flags |= (Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE) &
                                      ~Py_TPFLAGS_HAVE_GC;

            if (PyType_Ready(&type->ht_type) < 0)
                pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
        }

        size_t num_bases = rec->bases.size();
        auto bases = tuple(rec->bases);

        char *tp_doc = nullptr;
        if (rec->doc && options::show_user_defined_docstrings()) {
            /* Allocate memory for docstring (using PyObject_MALLOC, since
               Python will free this later on) */
            size_t size = strlen(rec->doc) + 1;
            tp_doc = (char *) PyObject_MALLOC(size);
            memcpy((void *) tp_doc, rec->doc, size);
        }

        /* Danger zone: from now (and until PyType_Ready), make sure to
           issue no Python C API calls which could potentially invoke the
           garbage collector (the GC will call type_traverse(), which will in
           turn find the newly constructed type in an invalid state) */

        auto type_holder = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
        auto type = (PyHeapTypeObject*) type_holder.ptr();

        if (!type_holder || !name)
            pybind11_fail(std::string(rec->name) + ": Unable to create type object!");

        /* Register supplemental type information in C++ dict */
        detail::type_info *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) type;
        tinfo->type_size = rec->type_size;
        tinfo->init_holder = rec->init_holder;
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        tinfo->default_holder = rec->default_holder;
        internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[type] = tinfo;

        /* Basic type attributes */
        type->ht_type.tp_name = strdup(full_name.c_str());
        type->ht_type.tp_basicsize = (ssize_t) rec->instance_size;

        if (num_bases > 0) {
            type->ht_type.tp_base = (PyTypeObject *) ((object) bases[0]).inc_ref().ptr();
            type->ht_type.tp_bases = bases.release().ptr();
            rec->multiple_inheritance |= num_bases > 1;
        }

        type->ht_name = name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        type->ht_qualname = ht_qualname.release().ptr();
#endif

        /* Metaclass */
        PYBIND11_OB_TYPE(type->ht_type) = (PyTypeObject *) metaclass.release().ptr();

        /* Supported protocols */
        type->ht_type.tp_as_number = &type->as_number;
        type->ht_type.tp_as_sequence = &type->as_sequence;
        type->ht_type.tp_as_mapping = &type->as_mapping;

        /* Supported elementary operations */
        type->ht_type.tp_init = (initproc) init;
        type->ht_type.tp_new = (newfunc) new_instance;
        type->ht_type.tp_dealloc = rec->dealloc;

        /* Support weak references (needed for the keep_alive feature) */
        type->ht_type.tp_weaklistoffset = offsetof(instance_essentials<void>, weakrefs);

        /* Flags */
        type->ht_type.tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
        type->ht_type.tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif
        type->ht_type.tp_flags &= ~Py_TPFLAGS_HAVE_GC;

        /* Support dynamic attributes */
        if (rec->dynamic_attr) {
            #if defined(PYPY_VERSION)
                pybind11_fail(std::string(rec->name) + ": dynamic attributes are "
                                                       "currently not supported in "
                                                       "conunction with PyPy!");
            #endif
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_GC;
            type->ht_type.tp_dictoffset = type->ht_type.tp_basicsize; // place the dict at the end
            type->ht_type.tp_basicsize += sizeof(PyObject *); // and allocate enough space for it
            type->ht_type.tp_getset = generic_getset;
            type->ht_type.tp_traverse = traverse;
            type->ht_type.tp_clear = clear;
        }

        if (rec->buffer_protocol) {
            type->ht_type.tp_as_buffer = &type->as_buffer;
#if PY_MAJOR_VERSION < 3
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_NEWBUFFER;
#endif
            type->as_buffer.bf_getbuffer = getbuffer;
            type->as_buffer.bf_releasebuffer = releasebuffer;
        }

        type->ht_type.tp_doc = tp_doc;

        m_ptr = type_holder.ptr();

        if (PyType_Ready(&type->ht_type) < 0)
            pybind11_fail(std::string(rec->name) + ": PyType_Ready failed (" +
                          detail::error_string() + ")!");

        if (scope_module) // Needed by pydoc
            attr("__module__") = scope_module;

        /* Register type with the parent scope */
        if (rec->scope)
            rec->scope.attr(handle(type->ht_name)) = *this;

        if (rec->multiple_inheritance)
            mark_parents_nonsimple(&type->ht_type);

        type_holder.release();
    }